

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wlcNtk.c
# Opt level: O0

int Wlc_NtkCreateLevels_(Wlc_Ntk_t *p)

{
  int iVar1;
  Wlc_Obj_t *p_00;
  int local_2c;
  int local_28;
  int LevelMax;
  int Level;
  int iFanin;
  int k;
  int i;
  Wlc_Obj_t *pObj;
  Wlc_Ntk_t *p_local;
  
  local_2c = 0;
  iVar1 = Wlc_NtkObjNumMax(p);
  Vec_IntFill(&p->vLevels,iVar1,0);
  for (iFanin = 1; iVar1 = Wlc_NtkObjNumMax(p), iFanin < iVar1; iFanin = iFanin + 1) {
    p_00 = Wlc_NtkObj(p,iFanin);
    local_28 = 0;
    for (Level = 0; iVar1 = Wlc_ObjFaninNum(p_00), Level < iVar1; Level = Level + 1) {
      iVar1 = Wlc_ObjFaninId(p_00,Level);
      iVar1 = Wlc_ObjLevelId(p,iVar1);
      local_28 = Abc_MaxInt(local_28,iVar1 + 1);
    }
    Vec_IntWriteEntry(&p->vLevels,iFanin,local_28);
    local_2c = Abc_MaxInt(local_2c,local_28);
  }
  return local_2c;
}

Assistant:

int Wlc_NtkCreateLevels_( Wlc_Ntk_t * p )
{
    Wlc_Obj_t * pObj; 
    int i, k, iFanin, Level, LevelMax = 0;
    Vec_IntFill( &p->vLevels, Wlc_NtkObjNumMax(p), 0 );
    Wlc_NtkForEachObj( p, pObj, i )
    {
        Level = 0;
        Wlc_ObjForEachFanin( pObj, iFanin, k )
            Level = Abc_MaxInt( Level, Wlc_ObjLevelId(p, iFanin) + 1 );
        Vec_IntWriteEntry( &p->vLevels, i, Level );
        LevelMax = Abc_MaxInt( LevelMax, Level );
    }
    return LevelMax;
}